

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O1

void test_linear_hash_get
               (planck_unit_test_t *tc,ion_key_t key,ion_err_t expected_status,
               ion_result_count_t expected_count,ion_value_t expected_value,
               linear_hash_table_t *linear_hash)

{
  long lVar1;
  long lVar2;
  ion_byte_t *key_00;
  planck_unit_test_t *state;
  ion_value_t __s1;
  int32_t expected;
  ion_result_count_t expected_00;
  planck_unit_result_t pVar3;
  int actual;
  ion_status_t iVar4;
  int line;
  undefined7 in_register_00000011;
  size_t sVar5;
  ion_byte_t *piVar6;
  ion_byte_t *__s;
  ulong uVar7;
  ion_byte_t *value;
  ion_byte_t aiStack_60 [8];
  ion_byte_t aiStack_58 [8];
  ion_byte_t *local_50;
  planck_unit_test_t *local_48;
  ion_value_t local_40;
  int32_t local_38;
  ion_result_count_t local_34;
  
  local_38 = (int32_t)CONCAT71(in_register_00000011,expected_status);
  sVar5 = (size_t)(linear_hash->super).record.value_size;
  uVar7 = sVar5 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar7;
  __s = aiStack_58 + lVar1;
  piVar6 = aiStack_60 + lVar1;
  local_50 = (ion_byte_t *)key;
  local_48 = tc;
  local_40 = expected_value;
  local_34 = expected_count;
  piVar6[0] = 0xe5;
  piVar6[1] = '\x14';
  piVar6[2] = '\x10';
  piVar6[3] = '\0';
  piVar6[4] = '\0';
  piVar6[5] = '\0';
  piVar6[6] = '\0';
  piVar6[7] = '\0';
  memset(__s,0x76,sVar5);
  state = local_48;
  lVar2 = -uVar7;
  value = __s + lVar2;
  builtin_memcpy(aiStack_58 + lVar2 + lVar1 + -8,"\x02\x15\x10",4);
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  memset(value,0x76,sVar5);
  key_00 = local_50;
  builtin_memcpy(aiStack_58 + lVar2 + lVar1 + -8,"\x11\x15\x10",4);
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  iVar4 = linear_hash_get(key_00,value,linear_hash);
  expected = local_38;
  builtin_memcpy(aiStack_58 + lVar2 + lVar1 + -8,"/\x15\x10",4);
  value[-4] = '\0';
  value[-3] = '\0';
  value[-2] = '\0';
  value[-1] = '\0';
  pVar3 = planck_unit_assert_int_are_equal
                    (state,expected,(int)iVar4.error,0x7f,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                    );
  expected_00 = local_34;
  if (pVar3 != '\0') {
    builtin_memcpy(aiStack_58 + lVar2 + lVar1 + -8,"U\x15\x10",4);
    value[-4] = '\0';
    value[-3] = '\0';
    value[-2] = '\0';
    value[-1] = '\0';
    pVar3 = planck_unit_assert_int_are_equal
                      (state,expected_00,iVar4.count,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                      );
    __s1 = local_40;
    if (pVar3 != '\0') {
      sVar5 = (size_t)(linear_hash->super).record.value_size;
      if (((ulong)iVar4 & 0xff) == 0) {
        value[-8] = 0x8f;
        value[-7] = '\x15';
        value[-6] = '\x10';
        value[-5] = '\0';
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        actual = memcmp(__s1,value,sVar5);
        line = 0x83;
      }
      else {
        builtin_memcpy(aiStack_58 + lVar2 + lVar1 + -8,"n\x15\x10",4);
        value[-4] = '\0';
        value[-3] = '\0';
        value[-2] = '\0';
        value[-1] = '\0';
        actual = memcmp(__s,value,sVar5);
        line = 0x87;
      }
      value[-8] = 0xa7;
      value[-7] = '\x15';
      value[-6] = '\x10';
      value[-5] = '\0';
      value[-4] = '\0';
      value[-3] = '\0';
      value[-2] = '\0';
      value[-1] = '\0';
      pVar3 = planck_unit_assert_int_are_equal
                        (state,0,actual,line,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                        );
      if (pVar3 != '\0') {
        return;
      }
    }
  }
  *(code **)(value + -8) = test_linear_hash_insert;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_get(
	planck_unit_test_t	*tc,
	ion_key_t			key,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_value_t			expected_value,
	linear_hash_table_t *linear_hash
) {
	ion_value_t defaultval = alloca(linear_hash->super.record.value_size);

	memset(defaultval, 0x76, linear_hash->super.record.value_size);

	ion_value_t retval = alloca(linear_hash->super.record.value_size);

	memcpy(retval, defaultval, linear_hash->super.record.value_size);

	ion_status_t status = linear_hash_get(key, retval, linear_hash);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(expected_value, retval, linear_hash->super.record.value_size));
	}
	else {
		/* Here, we check to see that the passed in space to write the value remains unchanged, if we have an error condition. */
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(defaultval, retval, linear_hash->super.record.value_size));
	}
}